

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessesView.cpp
# Opt level: O2

QVariant * convertToInt(QVariant *__return_storage_ptr__,QString *str)

{
  longlong lVar1;
  char *__nptr;
  QArrayDataPointer<char> QStack_48;
  char *end;
  
  QString::toLocal8Bit((QByteArray *)&QStack_48,str);
  __nptr = QStack_48.ptr;
  if (QStack_48.ptr == (char *)0x0) {
    __nptr = (char *)&QByteArray::_empty;
  }
  lVar1 = strtoll(__nptr,&end,10);
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
  if (*end == '\0') {
    QVariant::QVariant(__return_storage_ptr__,lVar1);
  }
  else {
    QString::toLocal8Bit((QByteArray *)&QStack_48,str);
    if (QStack_48.ptr == (char *)0x0) {
      QStack_48.ptr = (char *)&QByteArray::_empty;
    }
    QVariant::QVariant(__return_storage_ptr__,QStack_48.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
  }
  return __return_storage_ptr__;
}

Assistant:

inline QVariant convertToInt(const QString &str) {
    char *end;
    auto i = strtoll(str.toLocal8Bit().constData(), &end, 10); // check if value can be converted to integer

    if (*end == '\0')  {
        return i;
    } else {
        return str.toLocal8Bit().constData();
    }
}